

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_route.c
# Opt level: O2

int csp_route_work(void)

{
  csp_id_t_conflict idin;
  _Bool _Var1;
  int iVar2;
  csp_iface_t *pcVar3;
  csp_callback_t p_Var4;
  csp_socket_t *pcVar5;
  csp_conn_t *conn_00;
  uint8_t *puVar6;
  bool bVar7;
  csp_qfifo_t input;
  csp_conn_t *conn;
  csp_packet_t *packet;
  
  csp_conn_check_timeouts();
  iVar2 = csp_qfifo_read(&input);
  if (iVar2 != 0) {
    return -3;
  }
  packet = input.packet;
  if (input.packet == (csp_packet_t *)0x0) {
    return -3;
  }
  csp_input_hook(input.iface,input.packet);
  (input.iface)->rx = (input.iface)->rx + 1;
  (input.iface)->rxbytes = (input.iface)->rxbytes + (uint)(input.packet)->length;
  pcVar3 = csp_iflist_get_by_addr(((input.packet)->id).dst);
  bVar7 = true;
  if (pcVar3 == (csp_iface_t *)0x0) {
    iVar2 = csp_id_is_broadcast(((input.packet)->id).dst,input.iface);
    bVar7 = iVar2 != 0;
  }
  if ((!(bool)((csp_conf.dedup == '\x02' & bVar7 ^ 1U) & csp_conf.dedup != '\x03' &
              (csp_conf.dedup != '\x01' | bVar7))) &&
     (_Var1 = csp_dedup_is_duplicate(input.packet), _Var1)) {
    (input.iface)->drop = (input.iface)->drop + 1;
    goto LAB_00108bac;
  }
  csp_promisc_add(input.packet);
  if (!bVar7) {
    csp_send_direct((csp_id_t_conflict *)&(input.packet)->id,input.packet,input.iface);
    return 0;
  }
  p_Var4 = csp_port_get_callback((uint)((input.packet)->id).dport);
  if (p_Var4 != (csp_callback_t)0x0) {
    iVar2 = csp_route_security_check(0x40,input.iface,input.packet);
    if (iVar2 == 0) {
      (*p_Var4)(input.packet);
      return 0;
    }
    goto LAB_00108bac;
  }
  pcVar5 = csp_port_get_socket((uint)((input.packet)->id).dport);
  if ((pcVar5 != (csp_socket_t *)0x0) && ((pcVar5->opts >> 8 & 1) != 0)) {
    iVar2 = csp_route_security_check(pcVar5->opts,input.iface,input.packet);
    if (iVar2 == 0) {
      iVar2 = csp_queue_enqueue(pcVar5->rx_queue,&packet,0);
      if (iVar2 != 0) {
        csp_dbg_conn_ovf = csp_dbg_conn_ovf + '\x01';
        csp_buffer_free(packet);
        return 0;
      }
      return 0;
    }
    goto LAB_00108bac;
  }
  conn_00 = csp_conn_find_existing((csp_id_t_conflict *)&(input.packet)->id);
  conn = conn_00;
  if (conn_00 == (csp_conn_t *)0x0) {
    if ((pcVar5 == (csp_socket_t *)0x0) ||
       (iVar2 = csp_route_security_check(pcVar5->opts,input.iface,input.packet), iVar2 != 0))
    goto LAB_00108bac;
    idin.pri = ((input.packet)->id).pri;
    idin.flags = ((input.packet)->id).flags;
    idin.src = ((input.packet)->id).src;
    idin.dst = ((input.packet)->id).dst;
    idin.dport = ((input.packet)->id).dport;
    idin.sport = ((input.packet)->id).sport;
    conn_00 = csp_conn_new(idin,(csp_id_t_conflict)
                                ((ulong)((input.packet)->id).flags << 8 |
                                (ulong)((input.packet)->id).dst << 0x10 |
                                (ulong)((input.packet)->id).pri |
                                (ulong)((input.packet)->id).src << 0x20 |
                                (ulong)((input.packet)->id).sport << 0x30 |
                                (ulong)((input.packet)->id).dport << 0x38),CONN_SERVER);
    conn = conn_00;
    if (conn_00 != (csp_conn_t *)0x0) {
      conn_00->dest_socket = pcVar5;
      conn_00->opts = pcVar5->opts;
      goto LAB_00108a54;
    }
    puVar6 = &csp_dbg_conn_out;
  }
  else {
    iVar2 = csp_route_security_check(conn_00->opts,input.iface,input.packet);
    if (iVar2 != 0) goto LAB_00108bac;
LAB_00108a54:
    if ((((input.packet)->id).flags & 2) != 0) {
      _Var1 = csp_rdp_new_packet(conn_00,input.packet);
      if (!_Var1) {
        return 0;
      }
LAB_00108b9c:
      csp_close(conn_00);
      return 0;
    }
    iVar2 = csp_conn_enqueue_packet(conn_00,input.packet);
    if (iVar2 == 0) {
      if (conn_00->dest_socket == (csp_socket_t *)0x0) {
        return 0;
      }
      iVar2 = csp_queue_enqueue(conn_00->dest_socket->rx_queue,&conn,0);
      if (iVar2 == 0) {
        conn->dest_socket = (csp_socket_t *)0x0;
        return 0;
      }
      csp_dbg_conn_ovf = csp_dbg_conn_ovf + '\x01';
      conn_00 = conn;
      goto LAB_00108b9c;
    }
    puVar6 = &csp_dbg_conn_ovf;
  }
  *puVar6 = *puVar6 + '\x01';
LAB_00108bac:
  csp_buffer_free(input.packet);
  return 0;
}

Assistant:

int csp_route_work(void) {

	csp_qfifo_t input;
	csp_packet_t * packet;
	csp_conn_t * conn;
	csp_socket_t * socket;

#if (CSP_USE_RDP)
	/* Check connection timeouts (currently only for RDP) */
	csp_conn_check_timeouts();
#endif

	/* Get next packet to route */
	if (csp_qfifo_read(&input) != CSP_ERR_NONE) {
		return CSP_ERR_TIMEDOUT;
	}

	packet = input.packet;
	if (packet == NULL) {
		return CSP_ERR_TIMEDOUT;
	}

	csp_input_hook(input.iface, packet);

	/* Count the message */
	input.iface->rx++;
	input.iface->rxbytes += packet->length;

	/* The packet is to me, if the address matches that of any interface,
	 * or the address matches the broadcast address of the incoming interface */
	int is_to_me = (csp_iflist_get_by_addr(packet->id.dst) != NULL || (csp_id_is_broadcast(packet->id.dst, input.iface)));

	/* Deduplication */
	if ((csp_conf.dedup == CSP_DEDUP_ALL) ||
		((is_to_me) && (csp_conf.dedup == CSP_DEDUP_INCOMING)) ||
		((!is_to_me) && (csp_conf.dedup == CSP_DEDUP_FWD))) {
		if (csp_dedup_is_duplicate(packet)) {
			/* Discard packet */
			input.iface->drop++;
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}
	}

	/* Here there be promiscuous mode */
#if (CSP_USE_PROMISC)
	csp_promisc_add(packet);
#endif

	/* If the message is not to me, route the message to the correct interface */
	if (!is_to_me) {

		/* Otherwise, actually send the message */
		csp_send_direct(&packet->id, packet, input.iface);
		return CSP_ERR_NONE;

	}

	/* Discard packets with unsupported options */
	if (csp_route_check_options(input.iface, packet) != CSP_ERR_NONE) {
		csp_buffer_free(packet);
		return CSP_ERR_NONE;
	}

	/**
	 * Callbacks 
	 */
	csp_callback_t callback = csp_port_get_callback(packet->id.dport);
	if (callback) {

		if (csp_route_security_check(CSP_SO_CRC32REQ, input.iface, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		callback(packet);
		return CSP_ERR_NONE;
	}

	/**
	 * Sockets 
	 */

	/* The message is to me, search for incoming socket */
	socket = csp_port_get_socket(packet->id.dport);

	/* If the socket is connection-less, deliver now */
	if (socket && (socket->opts & CSP_SO_CONN_LESS)) {

		if (csp_route_security_check(socket->opts, input.iface, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		if (csp_queue_enqueue(socket->rx_queue, &packet, 0) != CSP_QUEUE_OK) {
			csp_dbg_conn_ovf++;
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}
		
		return CSP_ERR_NONE;
	}

	/* Search for an existing connection */
	conn = csp_conn_find_existing(&packet->id);

	/* If this is an incoming packet on a new connection */
	if (conn == NULL) {

		/* Reject packet if no matching socket is found */
		if (!socket) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		/* Run security check on incoming packet */
		if (csp_route_security_check(socket->opts, input.iface, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		/* New incoming connection accepted */
		csp_id_t idout;
		idout.pri = packet->id.pri;
		idout.src = packet->id.dst;
		idout.dst = packet->id.src;
		idout.dport = packet->id.sport;
		idout.sport = packet->id.dport;
		idout.flags = packet->id.flags;

		/* Create connection */
		conn = csp_conn_new(packet->id, idout, CONN_SERVER);

		if (!conn) {
			csp_dbg_conn_out++;
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}

		/* Store the socket queue and options */
		conn->dest_socket = socket;
		conn->opts = socket->opts;

		/* Packet to existing connection */
	} else {

		/* Run security check on incoming packet */
		if (csp_route_security_check(conn->opts, input.iface, packet) != CSP_ERR_NONE) {
			csp_buffer_free(packet);
			return CSP_ERR_NONE;
		}
	}

#if (CSP_USE_RDP)
	/* Pass packet to RDP module */
	if (packet->id.flags & CSP_FRDP) {
		bool close_connection = csp_rdp_new_packet(conn, packet);
		if (close_connection) {
			csp_close(conn);
		}
		return CSP_ERR_NONE;
	}
#endif

	/* Otherwise, enqueue directly */
	if (csp_conn_enqueue_packet(conn, packet) != CSP_ERR_NONE) {
		csp_dbg_conn_ovf++;
		csp_buffer_free(packet);
		return CSP_ERR_NONE;
	}

	/* Try to queue up the new connection pointer */
	if (conn->dest_socket != NULL) {
		if (csp_queue_enqueue(conn->dest_socket->rx_queue, &conn, 0) != CSP_QUEUE_OK) {
			csp_dbg_conn_ovf++;
			csp_close(conn);
			return CSP_ERR_NONE;
		}

		/* Ensure that this connection will not be posted to this socket again */
		conn->dest_socket = NULL;
	}

	return CSP_ERR_NONE;
}